

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

int input(WINDOW *win,char *str,int len,bool cont)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (win == (WINDOW *)0x0) {
    iVar4 = -1;
    iVar5 = -1;
  }
  else {
    iVar4 = win->_maxy + 1;
    iVar5 = win->_maxx + 1;
  }
  uVar3 = 0;
  do {
    iVar1 = wgetch(win);
    iVar6 = (int)uVar3;
    if (iVar1 == 0x157) {
LAB_001024a1:
      if (0 < iVar6) {
        return iVar6;
      }
    }
    else if (iVar1 == 0x107) {
      if (0 < iVar6) {
        uVar3 = (ulong)(iVar6 - 1);
        str[uVar3] = '\0';
        iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
        if (iVar1 != 0) {
LAB_00102645:
          std::__throw_system_error(iVar1);
        }
        if (win == (WINDOW *)0x0) {
          iVar6 = -1;
          iVar1 = -1;
        }
        else {
          iVar6 = (int)win->_cury;
          iVar1 = (int)win->_curx;
          if (win->_curx < 1) {
            if (win->_cury < 1) goto LAB_00102560;
            iVar6 = iVar6 + -1;
            iVar1 = ncolums;
          }
          iVar1 = iVar1 + -1;
          iVar2 = wmove(win,iVar6,iVar1);
          if (iVar2 != -1) {
            waddch(win,0x20);
          }
        }
LAB_00102560:
        wmove(win,iVar6,iVar1);
        pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
      }
    }
    else {
      if (iVar1 == 10) goto LAB_001024a1;
      if ((((0xb < iVar1 - 0x109U) && (3 < iVar1 - 0x102U)) && (iVar1 != 9)) &&
         ((iVar1 != 0x1b && (iVar6 < len)))) {
        uVar3 = (ulong)(iVar6 + 1);
        str[iVar6] = (char)iVar1;
        waddch(win,iVar1);
      }
    }
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
    if (iVar1 != 0) goto LAB_00102645;
    if (win == (WINDOW *)0x0) {
      iVar1 = -1;
      iVar6 = -1;
    }
    else {
      iVar1 = (int)win->_cury;
      iVar6 = (int)win->_curx;
    }
    if ((iVar1 == iVar4) && (iVar6 == iVar5)) {
      iVar4 = iVar4 + 1;
      wresize(win,iVar4,iVar5);
    }
    if (cont) {
      wattr_on(win,0x6600,0);
      mvwprintw(win,0,ncolums + -10,"%d/%d",uVar3,len);
      wattr_off(win,0x6600,0);
    }
    wmove(win,iVar1,iVar6);
    wrefresh(win);
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
  } while( true );
}

Assistant:

int  input(WINDOW *win, char *str, int len, bool cont) {
  int ymax, xmax;
  getmaxyx(win, ymax, xmax);
  int i = 0;
  while(1) {
    int c = wgetch(win);
    if(c == KEY_ENTER || c == 10) {
      if (i > 0)
        break;
    }
    else if (c == KEY_BACKSPACE) {
      if (i > 0) {
        str[--i] = '\0';
        int y, x;
        mutwin.lock();
        getyx(win, y, x);
        if (x > 0) {
          mvwaddch(win, y, --x, ' ');
        }
        else if (y > 0) {
          y--;
          x = ncolums;
          mvwaddch(win, y, --x, ' ');
        }
        wmove(win, y, x);
        mutwin.unlock();
      }
    }
    else if (!((265 <= c && 276 >=c) || (258 <= c && 261 >= c ) || (c == 27) || c == 9)) {
      if (i < len) {
        str[i++] = c;
        waddch(win, c);
      }
    }
    int x, y;

    mutwin.lock();
    getyx(win, y, x);
    if(y == ymax && x == xmax) {
      wresize(win, ++ymax, xmax);
    }
    if (cont) {
      wattron(win, COLOR_PAIR(102));
      mvwprintw(win, 0, ncolums - 10, "%d/%d", i, len);
      wattroff(win, COLOR_PAIR(102));
    }
    wmove(win, y,x);
    wrefresh(win);
    mutwin.unlock();
  }
  return (i);
}